

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O2

HaI32 dgConvexHull3d::ConvexCompareVertex(dgHullVertex *A,dgHullVertex *B,void *context)

{
  double dVar1;
  double *pdVar2;
  HaI32 i;
  int i_00;
  
  i_00 = 0;
  while( true ) {
    if (i_00 == 3) {
      return 0;
    }
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)A,i_00);
    dVar1 = *pdVar2;
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)B,i_00);
    if (dVar1 < *pdVar2) break;
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)A,i_00);
    dVar1 = *pdVar2;
    pdVar2 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)B,i_00);
    i_00 = i_00 + 1;
    if (*pdVar2 < dVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

hacd::HaI32 dgConvexHull3d::ConvexCompareVertex(const dgHullVertex* const  A, const dgHullVertex* const B, void* const context)
{
	HACD_FORCE_PARAMETER_REFERENCE(context);
	for (hacd::HaI32 i = 0; i < 3; i ++) {
		if ((*A)[i] < (*B)[i]) {
			return -1;
		} else if ((*A)[i] > (*B)[i]) {
			return 1;
		}
	}
	return 0;
}